

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void __thiscall
wabt::WastParser::WastParser
          (WastParser *this,WastLexer *lexer,Errors *errors,WastParseOptions *options)

{
  this->lexer_ = lexer;
  this->last_module_index_ = 0xffffffff;
  this->errors_ = errors;
  this->options_ = options;
  memset(&this->resolve_types_,0,200);
  return;
}

Assistant:

WastParser::WastParser(WastLexer* lexer,
                       Errors* errors,
                       WastParseOptions* options)
    : lexer_(lexer), errors_(errors), options_(options) {}